

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  bool bVar1;
  undefined1 local_68 [8];
  string dot_extension;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(dot_extension.field_2._M_local_buf + 8),".",&local_21);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dot_extension.field_2 + 8),extension);
  std::__cxx11::string::~string((string *)(dot_extension.field_2._M_local_buf + 8));
  bVar1 = String::EndsWithCaseInsensitive(&this->pathname_,(string *)local_68);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&dot_extension.field_2 + 8),&this->pathname_,0,
               (this->pathname_)._M_string_length - (long)dot_extension._M_dataplus._M_p);
    FilePath(__return_storage_ptr__,(string *)((long)&dot_extension.field_2 + 8));
    std::__cxx11::string::~string((string *)(dot_extension.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,&this->pathname_);
  }
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}